

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fttrigon.c
# Opt level: O3

void ft_trig_pseudo_rotate(FT_Vector *vec,FT_Angle theta)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  FT_Angle *pFVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  
  lVar4 = vec->x;
  lVar2 = vec->y;
  lVar7 = lVar4;
  if (theta < -0x2d0000) {
    do {
      lVar4 = lVar2;
      lVar2 = -lVar7;
      uVar6 = theta + 0x5a0000;
      bVar10 = (ulong)theta < 0xffffffffff790000;
      lVar7 = lVar4;
      theta = uVar6;
    } while (bVar10);
  }
  else {
    uVar6 = theta;
    lVar7 = lVar2;
    if (0x2d0000 < theta) {
      do {
        lVar2 = lVar4;
        lVar4 = -lVar7;
        uVar6 = theta - 0x5a0000;
        bVar10 = 0x870000 < (ulong)theta;
        theta = uVar6;
        lVar7 = lVar2;
      } while (bVar10);
    }
  }
  pFVar5 = ft_trig_arctan_table;
  lVar3 = 1;
  lVar7 = 1;
  do {
    lVar8 = lVar7 + lVar2 >> ((byte)lVar3 & 0x3f);
    lVar9 = lVar7 + lVar4 >> ((byte)lVar3 & 0x3f);
    lVar1 = *pFVar5;
    if ((long)uVar6 < 0) {
      lVar9 = -lVar9;
    }
    else {
      lVar8 = -lVar8;
      lVar1 = -lVar1;
    }
    uVar6 = uVar6 + lVar1;
    lVar4 = lVar4 + lVar8;
    lVar2 = lVar2 + lVar9;
    pFVar5 = pFVar5 + 1;
    lVar7 = lVar7 * 2;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x17);
  vec->x = lVar4;
  vec->y = lVar2;
  return;
}

Assistant:

static void
  ft_trig_pseudo_rotate( FT_Vector*  vec,
                         FT_Angle    theta )
  {
    FT_Int           i;
    FT_Fixed         x, y, xtemp, b;
    const FT_Angle  *arctanptr;


    x = vec->x;
    y = vec->y;

    /* Rotate inside [-PI/4,PI/4] sector */
    while ( theta < -FT_ANGLE_PI4 )
    {
      xtemp  =  y;
      y      = -x;
      x      =  xtemp;
      theta +=  FT_ANGLE_PI2;
    }

    while ( theta > FT_ANGLE_PI4 )
    {
      xtemp  = -y;
      y      =  x;
      x      =  xtemp;
      theta -=  FT_ANGLE_PI2;
    }

    arctanptr = ft_trig_arctan_table;

    /* Pseudorotations, with right shifts */
    for ( i = 1, b = 1; i < FT_TRIG_MAX_ITERS; b <<= 1, i++ )
    {
      if ( theta < 0 )
      {
        xtemp  = x + ( ( y + b ) >> i );
        y      = y - ( ( x + b ) >> i );
        x      = xtemp;
        theta += *arctanptr++;
      }
      else
      {
        xtemp  = x - ( ( y + b ) >> i );
        y      = y + ( ( x + b ) >> i );
        x      = xtemp;
        theta -= *arctanptr++;
      }
    }

    vec->x = x;
    vec->y = y;
  }